

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O2

base_learner * kernel_svm_setup(options_i *options,vw *all)

{
  bool bVar1;
  int iVar2;
  option_group_definition *poVar3;
  typed_option<unsigned_long> *ptVar4;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ptVar5;
  typed_option<float> *ptVar6;
  typed_option<int> *ptVar7;
  loss_function *plVar8;
  svm_model *psVar9;
  svm_example **ppsVar10;
  ulong uVar11;
  ostream *poVar12;
  double *pdVar13;
  int *piVar14;
  learner<svm_params,_example> *plVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  double dVar18;
  bool ksvm;
  free_ptr<svm_params> params;
  int degree;
  float bandwidth;
  allocator local_e73;
  allocator local_e72;
  allocator local_e71;
  allocator local_e70;
  allocator local_e6f;
  allocator local_e6e;
  allocator local_e6d;
  allocator local_e6c;
  allocator local_e6b;
  allocator local_e6a;
  allocator local_e69;
  allocator local_e68;
  allocator local_e67;
  allocator local_e66;
  allocator local_e65;
  allocator local_e64;
  allocator local_e63;
  allocator local_e62;
  allocator local_e61;
  string kernel_type;
  string local_e40;
  string local_e20 [32];
  string local_e00;
  string local_de0 [32];
  string local_dc0;
  string local_da0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d80;
  string local_d60;
  string local_d40 [32];
  string local_d20;
  string local_d00 [32];
  string local_ce0;
  string local_cc0 [32];
  string local_ca0;
  string local_c80 [32];
  string local_c60;
  string local_c40 [32];
  string local_c20;
  string local_c00 [32];
  string local_be0;
  string local_bc0;
  option_group_definition new_options;
  string loss_function;
  string local_b38 [64];
  bool local_af8;
  typed_option<unsigned_long> local_ac8;
  undefined1 local_a28 [160];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_988;
  undefined1 local_8e8 [160];
  typed_option<int> local_848;
  typed_option<int> local_7a8;
  typed_option<float> local_708;
  typed_option<float> local_668;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5c8;
  typed_option<unsigned_long> local_528;
  typed_option<unsigned_long> local_488;
  typed_option<unsigned_long> local_3e8;
  typed_option<unsigned_long> local_348;
  typed_option<bool> local_2a8;
  typed_option<bool> local_208;
  typed_option<unsigned_long> local_168;
  typed_option<bool> local_c8;
  
  scoped_calloc_or_throw<svm_params>();
  kernel_type._M_dataplus._M_p = (pointer)&kernel_type.field_2;
  kernel_type._M_string_length = 0;
  kernel_type.field_2._M_local_buf[0] = '\0';
  bandwidth = 1.0;
  degree = 2;
  ksvm = false;
  std::__cxx11::string::string((string *)&local_bc0,"Kernel SVM",(allocator *)&loss_function);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_bc0);
  std::__cxx11::string::~string((string *)&local_bc0);
  std::__cxx11::string::string((string *)&local_be0,"ksvm",&local_e61);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&loss_function,&local_be0,&ksvm);
  local_af8 = true;
  std::__cxx11::string::string(local_c00,"kernel svm",&local_e62);
  std::__cxx11::string::_M_assign(local_b38);
  VW::config::typed_option<bool>::typed_option(&local_c8,(typed_option<bool> *)&loss_function);
  poVar3 = VW::config::option_group_definition::add<bool>(&new_options,&local_c8);
  std::__cxx11::string::string((string *)&local_c20,"reprocess",&local_e63);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_ac8,&local_c20,
             &(params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->reprocess);
  ptVar4 = VW::config::typed_option<unsigned_long>::default_value(&local_ac8,1);
  std::__cxx11::string::string(local_c40,"number of reprocess steps for LASVM",&local_e64);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_168,ptVar4);
  poVar3 = VW::config::option_group_definition::add<unsigned_long>(poVar3,&local_168);
  std::__cxx11::string::string((string *)&local_c60,"pool_greedy",&local_e65);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_a28,&local_c60,
             &(params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->active_pool_greedy);
  std::__cxx11::string::string(local_c80,"use greedy selection on mini pools",&local_e66);
  std::__cxx11::string::_M_assign((string *)(local_a28 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_208,(typed_option<bool> *)local_a28);
  poVar3 = VW::config::option_group_definition::add<bool>(poVar3,&local_208);
  std::__cxx11::string::string((string *)&local_ca0,"para_active",&local_e67);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_8e8,&local_ca0,
             &(params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->para_active);
  std::__cxx11::string::string(local_cc0,"do parallel active learning",&local_e68);
  std::__cxx11::string::_M_assign((string *)(local_8e8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2a8,(typed_option<bool> *)local_8e8);
  poVar3 = VW::config::option_group_definition::add<bool>(poVar3,&local_2a8);
  std::__cxx11::string::string((string *)&local_ce0,"pool_size",&local_e69);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_3e8,&local_ce0,
             &(params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool_size);
  ptVar4 = VW::config::typed_option<unsigned_long>::default_value(&local_3e8,1);
  std::__cxx11::string::string(local_d00,"size of pools for active learning",&local_e6a);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_348,ptVar4);
  poVar3 = VW::config::option_group_definition::add<unsigned_long>(poVar3,&local_348);
  std::__cxx11::string::string((string *)&local_d20,"subsample",&local_e6b);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_528,&local_d20,
             &(params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->subsample);
  ptVar4 = VW::config::typed_option<unsigned_long>::default_value(&local_528,1);
  std::__cxx11::string::string(local_d40,"number of items to subsample from the pool",&local_e6c);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_488,ptVar4);
  poVar3 = VW::config::option_group_definition::add<unsigned_long>(poVar3,&local_488);
  std::__cxx11::string::string((string *)&local_d60,"kernel",&local_e6d);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_988,&local_d60,&kernel_type);
  local_988.super_base_option.m_keep = true;
  std::__cxx11::string::string((string *)&local_d80,"linear",&local_e6e);
  ptVar5 = VW::config::
           typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::default_value(&local_988,&local_d80);
  std::__cxx11::string::string(local_da0,"type of kernel (rbf or linear (default))",&local_e6f);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_5c8,ptVar5);
  poVar3 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar3,&local_5c8);
  std::__cxx11::string::string((string *)&local_dc0,"bandwidth",&local_e70);
  VW::config::typed_option<float>::typed_option(&local_708,&local_dc0,&bandwidth);
  local_708.super_base_option.m_keep = true;
  ptVar6 = VW::config::typed_option<float>::default_value(&local_708,1.0);
  std::__cxx11::string::string(local_de0,"bandwidth of rbf kernel",&local_e71);
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_668,ptVar6);
  poVar3 = VW::config::option_group_definition::add<float>(poVar3,&local_668);
  std::__cxx11::string::string((string *)&local_e00,"degree",&local_e72);
  VW::config::typed_option<int>::typed_option(&local_848,&local_e00,&degree);
  local_848.super_base_option.m_keep = true;
  ptVar7 = VW::config::typed_option<int>::default_value(&local_848,2);
  std::__cxx11::string::string(local_e20,"degree of poly kernel",&local_e73);
  std::__cxx11::string::_M_assign((string *)&(ptVar7->super_base_option).m_help);
  VW::config::typed_option<int>::typed_option(&local_7a8,ptVar7);
  VW::config::option_group_definition::add<int>(poVar3,&local_7a8);
  VW::config::typed_option<int>::~typed_option(&local_7a8);
  std::__cxx11::string::~string(local_e20);
  VW::config::typed_option<int>::~typed_option(&local_848);
  std::__cxx11::string::~string((string *)&local_e00);
  VW::config::typed_option<float>::~typed_option(&local_668);
  std::__cxx11::string::~string(local_de0);
  VW::config::typed_option<float>::~typed_option(&local_708);
  std::__cxx11::string::~string((string *)&local_dc0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_5c8);
  std::__cxx11::string::~string(local_da0);
  std::__cxx11::string::~string((string *)&local_d80);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_988);
  std::__cxx11::string::~string((string *)&local_d60);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_488);
  std::__cxx11::string::~string(local_d40);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_528);
  std::__cxx11::string::~string((string *)&local_d20);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_348);
  std::__cxx11::string::~string(local_d00);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_3e8);
  std::__cxx11::string::~string((string *)&local_ce0);
  VW::config::typed_option<bool>::~typed_option(&local_2a8);
  std::__cxx11::string::~string(local_cc0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_8e8);
  std::__cxx11::string::~string((string *)&local_ca0);
  VW::config::typed_option<bool>::~typed_option(&local_208);
  std::__cxx11::string::~string(local_c80);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_a28);
  std::__cxx11::string::~string((string *)&local_c60);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_168);
  std::__cxx11::string::~string(local_c40);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_ac8);
  std::__cxx11::string::~string((string *)&local_c20);
  VW::config::typed_option<bool>::~typed_option(&local_c8);
  std::__cxx11::string::~string(local_c00);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&loss_function);
  std::__cxx11::string::~string((string *)&local_be0);
  (**options->_vptr_options_i)(options,&new_options);
  if (ksvm == false) {
    plVar15 = (learner<svm_params,_example> *)0x0;
  }
  else {
    std::__cxx11::string::string((string *)&loss_function,"hinge",(allocator *)&local_ac8);
    if (all->loss != (loss_function *)0x0) {
      (*all->loss->_vptr_loss_function[9])();
    }
    std::__cxx11::string::string((string *)&local_e40,(string *)&loss_function);
    plVar8 = getLossFunction(all,&local_e40,0.0);
    all->loss = plVar8;
    std::__cxx11::string::~string((string *)&local_e40);
    psVar9 = calloc_or_throw<svm_model>();
    (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->model = psVar9;
    psVar9->num_support = 0;
    (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->maxcache = 0x40000000;
    (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->loss_sum = 0.0;
    (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all = all;
    if (all->active == true) {
      (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->active = true;
    }
    if ((params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->active == true) {
      (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->active_c = 1.0;
    }
    ppsVar10 = calloc_or_throw<svm_example*>
                         ((params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
                           super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool_size);
    (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool = ppsVar10;
    (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool_pos = 0;
    std::__cxx11::string::string((string *)&local_ac8,"subsample",(allocator *)local_a28);
    iVar2 = (*options->_vptr_options_i[1])(options,&local_ac8);
    if ((char)iVar2 == '\0') {
      bVar1 = (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->para_active;
      std::__cxx11::string::~string((string *)&local_ac8);
      if (bVar1 == true) {
        uVar11 = (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool_size /
                 all->all_reduce->total;
        auVar17._8_4_ = (int)(uVar11 >> 0x20);
        auVar17._0_8_ = uVar11;
        auVar17._12_4_ = 0x45300000;
        dVar18 = (auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
        uVar11 = (ulong)dVar18;
        (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->subsample =
             (long)(dVar18 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&local_ac8);
    }
    uVar16 = -(uint)(all->l2_lambda == 0.0);
    (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->lambda =
         (float)(~uVar16 & (uint)all->l2_lambda | uVar16 & 0x3f800000);
    poVar12 = std::operator<<(&((params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>.
                                 _M_t.super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                                 super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all->
                               trace_message).super_ostream,"Lambda = ");
    poVar12 = (ostream *)
              std::ostream::operator<<
                        (poVar12,(params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>.
                                  _M_t.super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                                  super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->lambda);
    std::endl<char,std::char_traits<char>>(poVar12);
    poVar12 = std::operator<<(&((params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>.
                                 _M_t.super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                                 super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all->
                               trace_message).super_ostream,"Kernel = ");
    poVar12 = std::operator<<(poVar12,(string *)&kernel_type);
    std::endl<char,std::char_traits<char>>(poVar12);
    iVar2 = std::__cxx11::string::compare((char *)&kernel_type);
    if (iVar2 == 0) {
      (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_type = 1;
      poVar12 = std::operator<<(&((params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>.
                                   _M_t.super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                                   super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all->
                                 trace_message).super_ostream,"bandwidth = ");
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,bandwidth);
      std::endl<char,std::char_traits<char>>(poVar12);
      pdVar13 = calloc_or_throw<double>();
      (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_params = pdVar13;
      *(float *)pdVar13 = bandwidth;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&kernel_type);
      if (iVar2 == 0) {
        (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_type = 2;
        poVar12 = std::operator<<(&((params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>
                                     ._M_t.super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                                     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all->
                                   trace_message).super_ostream,"degree = ");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,degree);
        std::endl<char,std::char_traits<char>>(poVar12);
        piVar14 = calloc_or_throw<int>();
        (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_params = piVar14;
        *piVar14 = degree;
      }
      else {
        (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_type = 0;
      }
    }
    parameters::stride_shift
              (&(params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all->weights,0);
    plVar15 = LEARNER::init_learner<svm_params,example,LEARNER::learner<char,example>>
                        (&params,learn,predict,1);
    *(code **)(plVar15 + 0x80) = save_load;
    *(undefined8 *)(plVar15 + 0x70) = *(undefined8 *)(plVar15 + 0x18);
    *(undefined8 *)(plVar15 + 0x78) = *(undefined8 *)(plVar15 + 0x20);
    *(undefined8 *)(plVar15 + 0xb8) = *(undefined8 *)(plVar15 + 0x18);
    *(undefined8 *)(plVar15 + 0xc0) = *(undefined8 *)(plVar15 + 0x20);
    *(code **)(plVar15 + 200) = finish;
    std::__cxx11::string::~string((string *)&loss_function);
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::__cxx11::string::~string((string *)&kernel_type);
  std::unique_ptr<svm_params,_void_(*)(void_*)>::~unique_ptr(&params);
  return (base_learner *)plVar15;
}

Assistant:

LEARNER::base_learner* kernel_svm_setup(options_i& options, vw& all)
{
  auto params = scoped_calloc_or_throw<svm_params>();
  std::string kernel_type;
  float bandwidth = 1.f;
  int degree = 2;

  bool ksvm = false;

  option_group_definition new_options("Kernel SVM");
  new_options.add(make_option("ksvm", ksvm).keep().help("kernel svm"))
      .add(make_option("reprocess", params->reprocess).default_value(1).help("number of reprocess steps for LASVM"))
      .add(make_option("pool_greedy", params->active_pool_greedy).help("use greedy selection on mini pools"))
      .add(make_option("para_active", params->para_active).help("do parallel active learning"))
      .add(make_option("pool_size", params->pool_size).default_value(1).help("size of pools for active learning"))
      .add(make_option("subsample", params->subsample)
               .default_value(1)
               .help("number of items to subsample from the pool"))
      .add(make_option("kernel", kernel_type)
               .keep()
               .default_value("linear")
               .help("type of kernel (rbf or linear (default))"))
      .add(make_option("bandwidth", bandwidth).keep().default_value(1.f).help("bandwidth of rbf kernel"))
      .add(make_option("degree", degree).keep().default_value(2).help("degree of poly kernel"));
  options.add_and_parse(new_options);

  if (!ksvm)
  {
    return nullptr;
  }

  string loss_function = "hinge";
  float loss_parameter = 0.0;
  delete all.loss;
  all.loss = getLossFunction(all, loss_function, (float)loss_parameter);

  params->model = &calloc_or_throw<svm_model>();
  params->model->num_support = 0;
  params->maxcache = 1024 * 1024 * 1024;
  params->loss_sum = 0.;
  params->all = &all;

  // This param comes from the active reduction.
  // During options refactor: this changes the semantics a bit - now this will only be true if --active was supplied and
  // NOT --simulation
  if (all.active)
    params->active = true;
  if (params->active)
    params->active_c = 1.;

  params->pool = calloc_or_throw<svm_example*>(params->pool_size);
  params->pool_pos = 0;

  if (!options.was_supplied("subsample") && params->para_active)
    params->subsample = (size_t)ceil(params->pool_size / all.all_reduce->total);

  params->lambda = all.l2_lambda;
  if (params->lambda == 0.)
    params->lambda = 1.;
  params->all->trace_message << "Lambda = " << params->lambda << endl;
  params->all->trace_message << "Kernel = " << kernel_type << endl;

  if (kernel_type.compare("rbf") == 0)
  {
    params->kernel_type = SVM_KER_RBF;
    params->all->trace_message << "bandwidth = " << bandwidth << endl;
    params->kernel_params = &calloc_or_throw<double>();
    *((float*)params->kernel_params) = bandwidth;
  }
  else if (kernel_type.compare("poly") == 0)
  {
    params->kernel_type = SVM_KER_POLY;
    params->all->trace_message << "degree = " << degree << endl;
    params->kernel_params = &calloc_or_throw<int>();
    *((int*)params->kernel_params) = degree;
  }
  else
    params->kernel_type = SVM_KER_LIN;

  params->all->weights.stride_shift(0);

  learner<svm_params, example>& l = init_learner(params, learn, predict, 1);
  l.set_save_load(save_load);
  l.set_finish(finish);
  return make_base(l);
}